

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O1

bool __thiscall QScrollArea::event(QScrollArea *this,QEvent *e)

{
  bool bVar1;
  
  if ((*(short *)(e + 8) == 100) || (*(short *)(e + 8) == 0x4c)) {
    QScrollAreaPrivate::updateScrollBars
              (*(QScrollAreaPrivate **)
                &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8);
  }
  bVar1 = QAbstractScrollArea::event((QAbstractScrollArea *)this,e);
  return bVar1;
}

Assistant:

bool QScrollArea::event(QEvent *e)
{
    Q_D(QScrollArea);
    if (e->type() == QEvent::StyleChange || e->type() == QEvent::LayoutRequest) {
        d->updateScrollBars();
    }
#ifdef QT_KEYPAD_NAVIGATION
    else if (QApplicationPrivate::keypadNavigationEnabled()) {
        if (e->type() == QEvent::Show)
            QApplication::instance()->installEventFilter(this);
        else if (e->type() == QEvent::Hide)
            QApplication::instance()->removeEventFilter(this);
    }
#endif
    return QAbstractScrollArea::event(e);
}